

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O2

void __thiscall tst_SerialiserCommon::basicSaveLoadData(tst_SerialiserCommon *this,QObject *parent)

{
  QTestData *pQVar1;
  QStringListModel *this_00;
  QStandardItemModel *pQVar2;
  QStringListModel *local_40;
  QAbstractItemModel *local_38;
  
  QTest::addColumn<QAbstractItemModel_const*>("sourceModel",(QAbstractItemModel **)0x0);
  QTest::addColumn<QAbstractItemModel*>("destinationModel",(QAbstractItemModel **)0x0);
  pQVar1 = (QTestData *)QTest::newRow("List Single Role");
  local_38 = createStringModel(this,parent);
  pQVar1 = operator<<(pQVar1,&local_38);
  this_00 = (QStringListModel *)operator_new(0x28);
  QStringListModel::QStringListModel(this_00,parent);
  local_40 = this_00;
  operator<<(pQVar1,(QAbstractItemModel **)&local_40);
  pQVar1 = (QTestData *)QTest::newRow("List Single Role Overwrite");
  local_38 = createStringModel(this,parent);
  pQVar1 = operator<<(pQVar1,&local_38);
  local_40 = (QStringListModel *)createStringModel(this,parent);
  operator<<(pQVar1,(QAbstractItemModel **)&local_40);
  pQVar1 = (QTestData *)QTest::newRow("Table Single Role");
  local_38 = createComplexModel(this,false,false,parent);
  pQVar1 = operator<<(pQVar1,&local_38);
  pQVar2 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar2,parent);
  local_40 = (QStringListModel *)pQVar2;
  operator<<(pQVar1,(QAbstractItemModel **)&local_40);
  pQVar1 = (QTestData *)QTest::newRow("Table Multi Roles");
  local_38 = createComplexModel(this,false,true,parent);
  pQVar1 = operator<<(pQVar1,&local_38);
  pQVar2 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar2,parent);
  local_40 = (QStringListModel *)pQVar2;
  operator<<(pQVar1,(QAbstractItemModel **)&local_40);
  pQVar1 = (QTestData *)QTest::newRow("Table Single Role Overwrite");
  local_38 = createComplexModel(this,false,false,parent);
  pQVar1 = operator<<(pQVar1,&local_38);
  local_40 = (QStringListModel *)createComplexModel(this,false,false,parent);
  operator<<(pQVar1,(QAbstractItemModel **)&local_40);
  pQVar1 = (QTestData *)QTest::newRow("Table Multi Roles Overwrite");
  local_38 = createComplexModel(this,false,true,parent);
  pQVar1 = operator<<(pQVar1,&local_38);
  local_40 = (QStringListModel *)createComplexModel(this,false,true,parent);
  operator<<(pQVar1,(QAbstractItemModel **)&local_40);
  pQVar1 = (QTestData *)QTest::newRow("Tree Single Role");
  local_38 = createComplexModel(this,true,false,parent);
  pQVar1 = operator<<(pQVar1,&local_38);
  pQVar2 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar2,parent);
  local_40 = (QStringListModel *)pQVar2;
  operator<<(pQVar1,(QAbstractItemModel **)&local_40);
  pQVar1 = (QTestData *)QTest::newRow("Tree Multi Roles");
  local_38 = createComplexModel(this,true,true,parent);
  pQVar1 = operator<<(pQVar1,&local_38);
  pQVar2 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar2,parent);
  local_40 = (QStringListModel *)pQVar2;
  operator<<(pQVar1,(QAbstractItemModel **)&local_40);
  pQVar1 = (QTestData *)QTest::newRow("Tree Single Role Overwrite");
  local_38 = createComplexModel(this,true,false,parent);
  pQVar1 = operator<<(pQVar1,&local_38);
  local_40 = (QStringListModel *)createComplexModel(this,true,false,parent);
  operator<<(pQVar1,(QAbstractItemModel **)&local_40);
  pQVar1 = (QTestData *)QTest::newRow("Tree Multi Roles Overwrite");
  local_38 = createComplexModel(this,true,true,parent);
  pQVar1 = operator<<(pQVar1,&local_38);
  local_40 = (QStringListModel *)createComplexModel(this,true,true,parent);
  operator<<(pQVar1,(QAbstractItemModel **)&local_40);
  return;
}

Assistant:

void tst_SerialiserCommon::basicSaveLoadData(QObject *parent)
{
    QTest::addColumn<const QAbstractItemModel *>("sourceModel");
    QTest::addColumn<QAbstractItemModel *>("destinationModel");
    QTest::newRow("List Single Role") << static_cast<const QAbstractItemModel *>(createStringModel(parent))
                                      << static_cast<QAbstractItemModel *>(new QStringListModel(parent));
    QTest::newRow("List Single Role Overwrite") << static_cast<const QAbstractItemModel *>(createStringModel(parent)) << createStringModel(parent);
#ifdef COMPLEX_MODEL_SUPPORT
    QTest::newRow("Table Single Role") << static_cast<const QAbstractItemModel *>(createComplexModel(false, false, parent))
                                       << static_cast<QAbstractItemModel *>(new ComplexModel(parent));
    QTest::newRow("Table Multi Roles") << static_cast<const QAbstractItemModel *>(createComplexModel(false, true, parent))
                                       << static_cast<QAbstractItemModel *>(new ComplexModel(parent));
    QTest::newRow("Table Single Role Overwrite") << static_cast<const QAbstractItemModel *>(createComplexModel(false, false, parent))
                                                 << createComplexModel(false, false, parent);
    QTest::newRow("Table Multi Roles Overwrite") << static_cast<const QAbstractItemModel *>(createComplexModel(false, true, parent))
                                                 << createComplexModel(false, true, parent);
    QTest::newRow("Tree Single Role") << static_cast<const QAbstractItemModel *>(createComplexModel(true, false, parent))
                                      << static_cast<QAbstractItemModel *>(new ComplexModel(parent));
    QTest::newRow("Tree Multi Roles") << static_cast<const QAbstractItemModel *>(createComplexModel(true, true, parent))
                                      << static_cast<QAbstractItemModel *>(new ComplexModel(parent));
    QTest::newRow("Tree Single Role Overwrite") << static_cast<const QAbstractItemModel *>(createComplexModel(true, false, parent))
                                                << createComplexModel(true, false, parent);
    QTest::newRow("Tree Multi Roles Overwrite") << static_cast<const QAbstractItemModel *>(createComplexModel(true, true, parent))
                                                << createComplexModel(true, true, parent);
#endif
}